

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<char>::assign<unsigned_char*,q20::identity>
          (void *param_1,long param_2,long param_3)

{
  long lVar1;
  bool bVar2;
  uchar *puVar3;
  qsizetype qVar4;
  char *pcVar5;
  QArrayDataPointer<char> *pQVar6;
  QArrayDataPointer<char> *pQVar7;
  invoke_result_t<q20::identity_&,_unsigned_char_&> puVar8;
  long in_FS_OFFSET;
  char *dend;
  char *dst;
  char *prependBufferEnd;
  char *capacityBegin;
  qsizetype offset;
  qsizetype n;
  bool IsIdentity;
  bool IsFwdIt;
  QArrayDataPointer<char> allocated;
  QArrayDataPointer<char> *in_stack_ffffffffffffff58;
  QArrayDataPointer<char> *in_stack_ffffffffffffff60;
  QArrayDataPointer<char> *in_stack_ffffffffffffff68;
  QArrayDataPointer<char> *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  QArrayDataPointer<char> *local_70;
  long local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (uchar *)std::distance<unsigned_char*>
                              (in_stack_ffffffffffffff78,(uchar *)in_stack_ffffffffffffff70);
  bVar2 = needsDetach(in_stack_ffffffffffffff60);
  if ((bVar2) ||
     (qVar4 = constAllocatedCapacity(in_stack_ffffffffffffff60), in_stack_ffffffffffffff78 = puVar3,
     qVar4 < (long)puVar3)) {
    detachCapacity(in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    QArrayDataPointer((QArrayDataPointer<char> *)param_1,(qsizetype)in_stack_ffffffffffffff78,
                      (qsizetype)in_stack_ffffffffffffff70,
                      (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    swap(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ~QArrayDataPointer(in_stack_ffffffffffffff60);
  }
  qVar4 = freeSpaceAtBegin(in_stack_ffffffffffffff68);
  pcVar5 = begin((QArrayDataPointer<char> *)0x36990f);
  local_70 = (QArrayDataPointer<char> *)(pcVar5 + -qVar4);
  pQVar6 = (QArrayDataPointer<char> *)begin((QArrayDataPointer<char> *)0x369928);
  pQVar7 = (QArrayDataPointer<char> *)end(in_stack_ffffffffffffff60);
  local_38 = param_2;
  if (qVar4 != 0) {
    setBegin((QArrayDataPointer<char> *)param_1,(char *)local_70);
    for (; local_70 != pQVar6; local_70 = (QArrayDataPointer<char> *)((long)&local_70->d + 1)) {
      if (local_38 == param_3) {
        std::destroy<char*>((char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        pcVar5 = begin((QArrayDataPointer<char> *)0x3699b3);
        ((QArrayDataPointer<char> *)param_1)->size = (long)local_70 - (long)pcVar5;
        goto LAB_00369abf;
      }
      in_stack_ffffffffffffff68 = local_70;
      puVar8 = std::invoke<q20::identity&,unsigned_char&>
                         ((identity *)in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58);
      q20::construct_at<char,unsigned_char&,void>((char *)in_stack_ffffffffffffff68,puVar8);
      local_38 = local_38 + 1;
    }
    ((QArrayDataPointer<char> *)param_1)->size = qVar4 + ((QArrayDataPointer<char> *)param_1)->size;
  }
  do {
    if (local_38 == param_3) {
      std::destroy<char*>((char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
LAB_00369a97:
      pcVar5 = begin((QArrayDataPointer<char> *)0x369aab);
      ((QArrayDataPointer<char> *)param_1)->size = (long)local_70 - (long)pcVar5;
LAB_00369abf:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    if (local_70 == pQVar7) {
      local_70 = (QArrayDataPointer<char> *)
                 std::uninitialized_copy<unsigned_char*,char*>
                           ((uchar *)in_stack_ffffffffffffff70,(uchar *)in_stack_ffffffffffffff68,
                            (char *)in_stack_ffffffffffffff60);
      goto LAB_00369a97;
    }
    puVar8 = std::invoke<q20::identity&,unsigned_char&>
                       ((identity *)in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58);
    *(uchar *)&local_70->d = *puVar8;
    local_70 = (QArrayDataPointer<char> *)((long)&local_70->d + 1);
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }